

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexNlaDebug.cpp
# Opt level: O0

HighsDebugStatus __thiscall
HSimplexNla::debugReportInvertSolutionError
          (HSimplexNla *this,bool transposed,HVector *true_solution,HVector *solution,
          HVector *residual,bool force)

{
  double dVar1;
  HighsDebugStatus HVar2;
  const_reference pvVar3;
  double *pdVar4;
  long in_RCX;
  long in_RDX;
  byte in_SIL;
  long *in_RDI;
  byte in_R9B;
  HVector *in_stack_00000018;
  HVector *in_stack_00000020;
  bool in_stack_0000002f;
  HSimplexNla *in_stack_00000030;
  double in_stack_00000038;
  bool in_stack_00000047;
  string *in_stack_00000048;
  HSimplexNla *in_stack_00000050;
  double residual_error_norm;
  double solve_error;
  HighsInt iRow;
  double solve_error_norm;
  HighsInt num_row;
  allocator local_71;
  string local_70 [32];
  double local_50;
  double local_48;
  int local_3c;
  double local_38;
  int local_30;
  byte local_29;
  long local_20;
  long local_18;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_29 = in_R9B & 1;
  local_30 = *(int *)(*in_RDI + 4);
  local_38 = 0.0;
  local_20 = in_RCX;
  local_18 = in_RDX;
  for (local_3c = 0; local_3c < local_30; local_3c = local_3c + 1) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_20 + 0x20),(long)local_3c)
    ;
    dVar1 = *pvVar3;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_18 + 0x20),(long)local_3c)
    ;
    local_48 = ABS(dVar1 - *pvVar3);
    pdVar4 = std::max<double>(&local_48,&local_38);
    local_38 = *pdVar4;
  }
  local_50 = debugInvertResidualError
                       (in_stack_00000030,in_stack_0000002f,in_stack_00000020,in_stack_00000018);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"random solution",&local_71);
  HVar2 = debugReportInvertSolutionError
                    (in_stack_00000050,in_stack_00000048,in_stack_00000047,in_stack_00000038,
                     (double)in_stack_00000030,in_stack_0000002f);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  return HVar2;
}

Assistant:

HighsDebugStatus HSimplexNla::debugReportInvertSolutionError(
    const bool transposed, const HVector& true_solution,
    const HVector& solution, HVector& residual, const bool force) const {
  const HighsInt num_row = this->lp_->num_row_;
  double solve_error_norm = 0;
  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    double solve_error = fabs(solution.array[iRow] - true_solution.array[iRow]);
    solve_error_norm = std::max(solve_error, solve_error_norm);
  }
  double residual_error_norm =
      debugInvertResidualError(transposed, solution, residual);

  return debugReportInvertSolutionError("random solution", transposed,
                                        solve_error_norm, residual_error_norm,
                                        force);
}